

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

_Bool container_iterator_prev
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 3) {
    if (*value != 0) {
      uVar4 = *value - 1;
      *value = uVar4;
      lVar3 = *(long *)((long)c + 8);
      iVar5 = it->index;
      if (*(ushort *)(lVar3 + (long)iVar5 * 4) <= uVar4) {
        return true;
      }
      uVar7 = iVar5 - 1;
      it->index = uVar7;
      if (0 < iVar5) {
        uVar7 = (uint)(ushort)(*(short *)(lVar3 + 2 + (ulong)uVar7 * 4) +
                              *(short *)(lVar3 + (ulong)uVar7 * 4));
        goto LAB_0010df41;
      }
    }
  }
  else if (iVar5 == 2) {
    iVar5 = it->index;
    uVar7 = iVar5 - 1;
    it->index = uVar7;
    if (0 < iVar5) {
      uVar7 = (uint)*(ushort *)(*(long *)((long)c + 8) + (ulong)uVar7 * 2);
LAB_0010df41:
      *value = (uint16_t)uVar7;
      return true;
    }
  }
  else {
    uVar1 = it->index;
    uVar7 = uVar1 - 1;
    it->index = uVar7;
    if (0 < (int)uVar1) {
      uVar6 = uVar7 >> 6;
      uVar8 = (ulong)(*(long *)(*(long *)((long)c + 8) + (ulong)uVar6 * 8) << (~(byte)uVar7 & 0x3f))
              >> (~(byte)uVar7 & 0x3f);
      bVar11 = uVar8 != 0;
      if ((!bVar11) && (uVar6 = 0xffffffff, 0x40 < uVar1)) {
        uVar10 = (ulong)(uVar7 >> 6);
        do {
          uVar9 = uVar10 - 1;
          uVar8 = *(ulong *)(*(long *)((long)c + 8) + uVar9 * 8);
          bVar11 = uVar8 != 0;
          if (bVar11) {
            uVar6 = (uint)uVar9;
            break;
          }
          bVar2 = 1 < (long)uVar10;
          uVar10 = uVar9;
        } while (bVar2);
      }
      if (!bVar11) {
        return false;
      }
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar7 = (uVar6 * 0x40 - ((uint)lVar3 ^ 0x3f)) + 0x3f;
      it->index = uVar7;
      goto LAB_0010df41;
    }
  }
  return false;
}

Assistant:

bool container_iterator_prev(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }

            const bitset_container_t *bc = const_CAST_bitset(c);
            int32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX >> (63 - (it->index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bc->words[wordindex];
            }
            if (word == 0) {
                return false;
            }

            it->index = (wordindex * 64) + (63 - roaring_leading_zeroes(word));
            *value = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == 0) {
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            (*value)--;
            if (*value >= rc->runs[it->index].value) {
                return true;
            }

            if (--it->index < 0) {
                return false;
            }

            *value = rc->runs[it->index].value + rc->runs[it->index].length;
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}